

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

void __thiscall Clasp::Solver::updateVars(Solver *this)

{
  size_type sVar1;
  uint32 nv;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> local_28;
  
  sVar1 = (this->assign_).assign_.ebo_.size;
  nv = (this->shared_->varInfo_).ebo_.size;
  if (nv - 1 < sVar1 - 1) {
    popVars(this,sVar1 - nv,false,(ConstraintDB *)0x0);
    return;
  }
  Assignment::resize(&this->assign_,nv);
  local_28.buf_ = (buf_type *)0x0;
  local_28._8_4_ = 0;
  local_28.left_ = 0;
  local_28.right_ = 0;
  bk_lib::
  pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
  ::resize(&this->watches_,(this->assign_).assign_.ebo_.size * 2,
           (left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U> *)&local_28);
  bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::release(&local_28);
  return;
}

Assistant:

void Solver::updateVars() {
	if (numVars() > shared_->numVars()) {
		popVars(numVars() - shared_->numVars(), false, 0);
	}
	else {
		assign_.resize(shared_->numVars() + 1);
		watches_.resize(assign_.numVars()<<1);
	}
}